

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_data.cpp
# Opt level: O3

void __thiscall
duckdb::ColumnData::InitializePrefetch
          (ColumnData *this,PrefetchState *prefetch_state,ColumnScanState *scan_state,
          idx_t remaining)

{
  ColumnScanState *extraout_RDX;
  ColumnScanState *pCVar1;
  ColumnScanState *extraout_RDX_00;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  ColumnSegment *this_00;
  
  this_00 = scan_state->current;
  if (this_00 != (ColumnSegment *)0x0) {
    pCVar1 = scan_state;
    if (scan_state->initialized == false) {
      ColumnSegment::InitializePrefetch(this_00,prefetch_state,scan_state);
      pCVar1 = extraout_RDX;
    }
    if (remaining != 0) {
      uVar3 = ((this_00->super_SegmentBase<duckdb::ColumnSegment>).start - scan_state->row_index) +
              (this_00->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>._M_i;
      if (remaining < uVar3) {
        uVar3 = remaining;
      }
      uVar2 = remaining - uVar3;
      if (uVar2 != 0) {
        lVar4 = uVar3 + scan_state->row_index;
        do {
          this_00 = (this_00->super_SegmentBase<duckdb::ColumnSegment>).next._M_b._M_p;
          if (this_00 == (ColumnSegment *)0x0) {
            return;
          }
          ColumnSegment::InitializePrefetch(this_00,prefetch_state,pCVar1);
          uVar3 = ((this_00->super_SegmentBase<duckdb::ColumnSegment>).start - lVar4) +
                  (this_00->super_SegmentBase<duckdb::ColumnSegment>).count.
                  super___atomic_base<unsigned_long>._M_i;
          if (uVar2 < uVar3) {
            uVar3 = uVar2;
          }
          lVar4 = lVar4 + uVar3;
          uVar2 = uVar2 - uVar3;
          pCVar1 = extraout_RDX_00;
        } while (uVar2 != 0);
      }
    }
  }
  return;
}

Assistant:

void ColumnData::InitializePrefetch(PrefetchState &prefetch_state, ColumnScanState &scan_state, idx_t remaining) {
	auto current_segment = scan_state.current;
	if (!current_segment) {
		return;
	}
	if (!scan_state.initialized) {
		// need to prefetch for the current segment if we have not yet initialized the scan for this segment
		scan_state.current->InitializePrefetch(prefetch_state, scan_state);
	}
	idx_t row_index = scan_state.row_index;
	while (remaining > 0) {
		idx_t scan_count = MinValue<idx_t>(remaining, current_segment->start + current_segment->count - row_index);
		remaining -= scan_count;
		row_index += scan_count;
		if (remaining > 0) {
			auto next = data.GetNextSegment(current_segment);
			if (!next) {
				break;
			}
			next->InitializePrefetch(prefetch_state, scan_state);
			current_segment = next;
		}
	}
}